

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O2

void __thiscall Nes_Square::clock_sweep(Nes_Square *this,int negative_adjust)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar5;
  uint uVar6;
  uint uVar4;
  
  bVar1 = (this->super_Nes_Envelope).super_Nes_Osc.regs[1];
  iVar3 = this->sweep_delay;
  this->sweep_delay = iVar3 + -1;
  if (iVar3 < 1) {
    if (((bVar1 & 7) != 0) && ((char)bVar1 < '\0')) {
      bVar2 = (this->super_Nes_Envelope).super_Nes_Osc.regs[3];
      uVar5 = (uint)(this->super_Nes_Envelope).super_Nes_Osc.regs[2] | (bVar2 & 7) << 8;
      if (7 < uVar5) {
        uVar6 = uVar5 >> (bVar1 & 7);
        uVar4 = negative_adjust - uVar6;
        if ((bVar1 & 8) == 0) {
          uVar4 = uVar6;
        }
        iVar3 = uVar4 + uVar5;
        if (iVar3 < 0x800) {
          (this->super_Nes_Envelope).super_Nes_Osc.regs[2] = (uchar)iVar3;
          (this->super_Nes_Envelope).super_Nes_Osc.regs[3] =
               (byte)((uint)iVar3 >> 8) & 7 | bVar2 & 0xf8;
        }
      }
    }
  }
  else if (((this->super_Nes_Envelope).super_Nes_Osc.reg_written[1] & 1U) == 0) {
    return;
  }
  (this->super_Nes_Envelope).super_Nes_Osc.reg_written[1] = false;
  this->sweep_delay = bVar1 >> 4 & 7;
  return;
}

Assistant:

void Nes_Square::clock_sweep( int negative_adjust )
{
	int sweep = regs [1];
	
	if ( --sweep_delay < 0 )
	{
		reg_written [1] = true;
		
		int period = this->period();
		int shift = sweep & shift_mask;
		if ( shift && (sweep & 0x80) && period >= 8 )
		{
			int offset = period >> shift;
			
			if ( sweep & negate_flag )
				offset = negative_adjust - offset;
			
			if ( period + offset < 0x800 )
			{
				period += offset;
				// rewrite period
				regs [2] = period & 0xFF;
				regs [3] = (regs [3] & ~7) | ((period >> 8) & 7);
			}
		}
	}
	
	if ( reg_written [1] ) {
		reg_written [1] = false;
		sweep_delay = (sweep >> 4) & 7;
	}
}